

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_cvts_d_mips(CPUMIPSState *env,uint64_t fdt0)

{
  float32 fVar1;
  uintptr_t unaff_retaddr;
  uint32_t fst2;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  fVar1 = float64_to_float32_mips(fdt0,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint32_t helper_float_cvts_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t fst2;

    fst2 = float64_to_float32(fdt0, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fst2;
}